

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subtraction.h
# Opt level: O0

void __thiscall Subtraction_Simple_Test::TestBody(Subtraction_Simple_Test *this)

{
  bool bVar1;
  char *pcVar2;
  AssertHelper local_440;
  Message local_438;
  string local_430;
  undefined1 local_410 [8];
  AssertionResult gtest_ar_3;
  Message local_3f8;
  string local_3f0;
  undefined1 local_3d0 [8];
  AssertionResult gtest_ar_2;
  Message local_3b8;
  string local_3b0;
  undefined1 local_390 [8];
  AssertionResult gtest_ar_1;
  Message local_378;
  string local_370;
  undefined1 local_350 [8];
  AssertionResult gtest_ar;
  string local_338;
  BigNumber local_318;
  allocator local_2e9;
  string local_2e8;
  BigNumber local_2c8;
  undefined1 local_2a0 [8];
  BigNumber num_4;
  string local_270;
  BigNumber local_250;
  allocator local_221;
  string local_220;
  BigNumber local_200;
  undefined1 local_1d8 [8];
  BigNumber num_3;
  string local_1a8;
  BigNumber local_188;
  allocator local_159;
  string local_158;
  BigNumber local_138;
  undefined1 local_110 [8];
  BigNumber num_2;
  string local_e0;
  BigNumber local_c0;
  allocator local_81;
  string local_80;
  BigNumber local_60;
  undefined1 local_38 [8];
  BigNumber num_1;
  Subtraction_Simple_Test *this_local;
  
  num_1._32_8_ = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_80,"0",&local_81);
  BigNumber::BigNumber(&local_60,&local_80);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_e0,"0",(allocator *)&num_2.field_0x27);
  BigNumber::BigNumber(&local_c0,&local_e0);
  BigNumber::operator-((BigNumber *)local_38,&local_60,&local_c0);
  BigNumber::~BigNumber(&local_c0);
  std::__cxx11::string::~string((string *)&local_e0);
  std::allocator<char>::~allocator((allocator<char> *)&num_2.field_0x27);
  BigNumber::~BigNumber(&local_60);
  std::__cxx11::string::~string((string *)&local_80);
  std::allocator<char>::~allocator((allocator<char> *)&local_81);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_158,"0",&local_159);
  BigNumber::BigNumber(&local_138,&local_158);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1a8,"1",(allocator *)&num_3.field_0x27);
  BigNumber::BigNumber(&local_188,&local_1a8);
  BigNumber::operator-((BigNumber *)local_110,&local_138,&local_188);
  BigNumber::~BigNumber(&local_188);
  std::__cxx11::string::~string((string *)&local_1a8);
  std::allocator<char>::~allocator((allocator<char> *)&num_3.field_0x27);
  BigNumber::~BigNumber(&local_138);
  std::__cxx11::string::~string((string *)&local_158);
  std::allocator<char>::~allocator((allocator<char> *)&local_159);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_220,"-1",&local_221);
  BigNumber::BigNumber(&local_200,&local_220);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_270,"1",(allocator *)&num_4.field_0x27);
  BigNumber::BigNumber(&local_250,&local_270);
  BigNumber::operator-((BigNumber *)local_1d8,&local_200,&local_250);
  BigNumber::~BigNumber(&local_250);
  std::__cxx11::string::~string((string *)&local_270);
  std::allocator<char>::~allocator((allocator<char> *)&num_4.field_0x27);
  BigNumber::~BigNumber(&local_200);
  std::__cxx11::string::~string((string *)&local_220);
  std::allocator<char>::~allocator((allocator<char> *)&local_221);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_2e8,"-1",&local_2e9);
  BigNumber::BigNumber(&local_2c8,&local_2e8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_338,"0",(allocator *)((long)&gtest_ar.message_.ptr_ + 7));
  BigNumber::BigNumber(&local_318,&local_338);
  BigNumber::operator-((BigNumber *)local_2a0,&local_2c8,&local_318);
  BigNumber::~BigNumber(&local_318);
  std::__cxx11::string::~string((string *)&local_338);
  std::allocator<char>::~allocator((allocator<char> *)((long)&gtest_ar.message_.ptr_ + 7));
  BigNumber::~BigNumber(&local_2c8);
  std::__cxx11::string::~string((string *)&local_2e8);
  std::allocator<char>::~allocator((allocator<char> *)&local_2e9);
  BigNumber::toString_abi_cxx11_(&local_370,(BigNumber *)local_38);
  testing::internal::EqHelper<false>::Compare<char[2],std::__cxx11::string>
            ((EqHelper<false> *)local_350,"\"0\"","num_1.toString()",(char (*) [2])0x44ccea,
             &local_370);
  std::__cxx11::string::~string((string *)&local_370);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_350);
  if (!bVar1) {
    testing::Message::Message(&local_378);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_350);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/zhangyifei-chelsea[P]practice_in_winter_vacation_2017/oop/gjd/test/subtraction.h"
               ,0xf,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,&local_378);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(&local_378);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_350);
  BigNumber::toString_abi_cxx11_(&local_3b0,(BigNumber *)local_110);
  testing::internal::EqHelper<false>::Compare<char[3],std::__cxx11::string>
            ((EqHelper<false> *)local_390,"\"-1\"","num_2.toString()",(char (*) [3])0x44c201,
             &local_3b0);
  std::__cxx11::string::~string((string *)&local_3b0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_390);
  if (!bVar1) {
    testing::Message::Message(&local_3b8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_390);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/zhangyifei-chelsea[P]practice_in_winter_vacation_2017/oop/gjd/test/subtraction.h"
               ,0x10,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_3b8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
    testing::Message::~Message(&local_3b8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_390);
  BigNumber::toString_abi_cxx11_(&local_3f0,(BigNumber *)local_1d8);
  testing::internal::EqHelper<false>::Compare<char[3],std::__cxx11::string>
            ((EqHelper<false> *)local_3d0,"\"-2\"","num_3.toString()",(char (*) [3])"-2",&local_3f0)
  ;
  std::__cxx11::string::~string((string *)&local_3f0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_3d0);
  if (!bVar1) {
    testing::Message::Message(&local_3f8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_3d0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_3.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/zhangyifei-chelsea[P]practice_in_winter_vacation_2017/oop/gjd/test/subtraction.h"
               ,0x11,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,&local_3f8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
    testing::Message::~Message(&local_3f8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_3d0);
  BigNumber::toString_abi_cxx11_(&local_430,(BigNumber *)local_2a0);
  testing::internal::EqHelper<false>::Compare<char[3],std::__cxx11::string>
            ((EqHelper<false> *)local_410,"\"-1\"","num_4.toString()",(char (*) [3])0x44c201,
             &local_430);
  std::__cxx11::string::~string((string *)&local_430);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_410);
  if (!bVar1) {
    testing::Message::Message(&local_438);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_410);
    testing::internal::AssertHelper::AssertHelper
              (&local_440,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/zhangyifei-chelsea[P]practice_in_winter_vacation_2017/oop/gjd/test/subtraction.h"
               ,0x12,pcVar2);
    testing::internal::AssertHelper::operator=(&local_440,&local_438);
    testing::internal::AssertHelper::~AssertHelper(&local_440);
    testing::Message::~Message(&local_438);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_410);
  BigNumber::~BigNumber((BigNumber *)local_2a0);
  BigNumber::~BigNumber((BigNumber *)local_1d8);
  BigNumber::~BigNumber((BigNumber *)local_110);
  BigNumber::~BigNumber((BigNumber *)local_38);
  return;
}

Assistant:

TEST(Subtraction, Simple)
{
    BigNumber num_1 = BigNumber("0") - BigNumber("0");
    BigNumber num_2 = BigNumber("0") - BigNumber("1");
    BigNumber num_3 = BigNumber("-1") - BigNumber("1");
    BigNumber num_4 = BigNumber("-1") - BigNumber("0");
    EXPECT_EQ("0", num_1.toString());
    EXPECT_EQ("-1", num_2.toString());
    EXPECT_EQ("-2", num_3.toString());
    EXPECT_EQ("-1", num_4.toString());
}